

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsGetProxyProperties(JsValueRef object,bool *isProxy,JsValueRef *target,JsValueRef *handler)

{
  anon_class_32_4_a3a7e0f1 fn;
  JsErrorCode JVar1;
  JsValueRef *local_28;
  JsValueRef *handler_local;
  JsValueRef *target_local;
  bool *isProxy_local;
  JsValueRef object_local;
  
  fn.isProxy = (bool **)&target_local;
  fn.object = &isProxy_local;
  fn.target = &handler_local;
  fn.handler = &local_28;
  local_28 = handler;
  handler_local = target;
  target_local = (JsValueRef *)isProxy;
  isProxy_local = (bool *)object;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetProxyProperties::__0>(fn,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetProxyProperties(_In_ JsValueRef object, _Out_ bool* isProxy, _Out_opt_ JsValueRef* target, _Out_opt_ JsValueRef* handler)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        VALIDATE_INCOMING_REFERENCE(object, scriptContext);
        PARAM_NOT_NULL(isProxy);

        if (target != nullptr)
        {
            *target = JS_INVALID_REFERENCE;
        }

        if (handler != nullptr)
        {
            *handler = JS_INVALID_REFERENCE;
        }

        *isProxy = Js::VarIs<Js::JavascriptProxy>(object);

        if (!*isProxy)
        {
            return JsNoError;
        }

        Js::JavascriptProxy* proxy = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
        bool revoked = proxy->IsRevoked();

        if (target != nullptr && !revoked)
        {
            *target = static_cast<JsValueRef>(proxy->GetTarget());
        }

        if (handler != nullptr && !revoked)
        {
            *handler = static_cast<JsValueRef>(proxy->GetHandler());
        }

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}